

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddCof.c
# Opt level: O0

DdNode * Cudd_Cofactor(DdManager *dd,DdNode *f,DdNode *g)

{
  DdNode *zero;
  DdNode *res;
  DdNode *g_local;
  DdNode *f_local;
  DdManager *dd_local;
  
  if ((g == (DdNode *)((ulong)dd->one ^ 1)) || (g == dd->zero)) {
    fprintf((FILE *)dd->err,"Cudd_Cofactor: Invalid restriction 1\n");
    dd->errorCode = CUDD_INVALID_ARG;
    dd_local = (DdManager *)0x0;
  }
  else {
    do {
      dd->reordered = 0;
      dd_local = (DdManager *)cuddCofactorRecur(dd,f,g);
    } while (dd->reordered == 1);
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode *
Cudd_Cofactor(
  DdManager * dd,
  DdNode * f,
  DdNode * g)
{
    DdNode *res,*zero;

    zero = Cudd_Not(DD_ONE(dd));
    if (g == zero || g == DD_ZERO(dd)) {
        (void) fprintf(dd->err,"Cudd_Cofactor: Invalid restriction 1\n");
        dd->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }
    do {
        dd->reordered = 0;
        res = cuddCofactorRecur(dd,f,g);
    } while (dd->reordered == 1);
    return(res);

}